

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O3

int UpnpSetMaxContentLength(size_t contentLength)

{
  int iVar1;
  
  iVar1 = -0x74;
  if (UpnpSdkInit == 1) {
    iVar1 = 0;
    g_maxContentLength = contentLength;
  }
  return iVar1;
}

Assistant:

int UpnpSetMaxContentLength(size_t contentLength)
{
	int errCode = UPNP_E_SUCCESS;

	do {
		if (UpnpSdkInit != 1) {
			errCode = UPNP_E_FINISH;
			break;
		}
		g_maxContentLength = contentLength;
	} while (0);

	return errCode;
}